

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall
Js::ScriptContext::LogDataForFunctionBody
          (ScriptContext *this,FunctionBody *body,uint idx,bool isRejit)

{
  bool bVar1;
  Recycler *pRVar2;
  WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
  *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar3;
  RejitStats *this_01;
  uint local_a0 [2];
  uint val;
  undefined8 local_90;
  TrackAllocData local_88;
  RejitStats *local_60;
  RejitStats *stats;
  undefined8 local_50;
  TrackAllocData local_48;
  byte local_1d;
  uint local_1c;
  bool isRejit_local;
  FunctionBody *pFStack_18;
  uint idx_local;
  FunctionBody *body_local;
  ScriptContext *this_local;
  
  local_1d = isRejit;
  local_1c = idx;
  pFStack_18 = body;
  body_local = (FunctionBody *)this;
  if (this->rejitStatsMap == (RejitStatsMap *)0x0) {
    pRVar2 = this->recycler;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,
               (type_info *)
               &JsUtil::
                WeaklyReferencedKeyDictionary<Js::FunctionBody_const,Js::ScriptContext::RejitStats*,DefaultComparer<Js::FunctionBody_const*>,true>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
               ,0x18b4);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_48);
    stats = (RejitStats *)Memory::Recycler::AllocInlined;
    local_50 = 0;
    this_00 = (WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
               *)new<Memory::Recycler>(0x50,pRVar2,0x43c4b0);
    JsUtil::
    WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
    ::WeaklyReferencedKeyDictionary(this_00,this->recycler,0,(EntryRemovalCallback *)0x0);
    this->rejitStatsMap = this_00;
    BindReference(this,this->rejitStatsMap);
  }
  local_60 = (RejitStats *)0x0;
  bVar1 = JsUtil::
          WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
          ::TryGetValue(this->rejitStatsMap,pFStack_18,&local_60);
  if (!bVar1) {
    pAVar3 = &GeneralAllocator(this)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_88,(type_info *)&RejitStats::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
               ,0x18bb);
    pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar3,&local_88);
    _val = Memory::ArenaAllocator::Alloc;
    local_90 = 0;
    this_01 = (RejitStats *)new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar3,0x3f67b0);
    RejitStats::RejitStats(this_01,this);
    local_60 = this_01;
    JsUtil::
    WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
    ::Item(this->rejitStatsMap,pFStack_18,this_01);
  }
  if ((local_1d & 1) == 0) {
    bVar1 = JsUtil::
            BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(local_60->m_bailoutReasonCounts,&local_1c);
    if (bVar1) {
      local_a0[0] = JsUtil::
                    BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::Item(local_60->m_bailoutReasonCounts,&local_1c);
      local_a0[0] = local_a0[0] + 1;
      JsUtil::
      BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Item(local_60->m_bailoutReasonCounts,&local_1c,local_a0);
    }
    else {
      local_a0[1] = 1;
      JsUtil::
      BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Item(local_60->m_bailoutReasonCounts,&local_1c,local_a0 + 1);
    }
  }
  else {
    local_60->m_rejitReasonCounts[local_1c] = local_60->m_rejitReasonCounts[local_1c] + 1;
  }
  return;
}

Assistant:

void ScriptContext::LogDataForFunctionBody(Js::FunctionBody *body, uint idx, bool isRejit)
    {
        if (rejitStatsMap == NULL)
        {
            rejitStatsMap = RecyclerNew(this->recycler, RejitStatsMap, this->recycler);
            BindReference(rejitStatsMap);
        }

        RejitStats *stats = NULL;
        if (!rejitStatsMap->TryGetValue(body, &stats))
        {
            stats = Anew(GeneralAllocator(), RejitStats, this);
            rejitStatsMap->Item(body, stats);
        }

        if (isRejit)
        {
            stats->m_rejitReasonCounts[idx]++;
        }
        else
        {
            if (!stats->m_bailoutReasonCounts->ContainsKey(idx))
            {
                stats->m_bailoutReasonCounts->Item(idx, 1);
            }
            else
            {
                uint val = stats->m_bailoutReasonCounts->Item(idx);
                ++val;
                stats->m_bailoutReasonCounts->Item(idx, val);
            }
        }
    }